

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::
Action<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>::
Perform(Action<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
        *this,ArgumentTuple *args)

{
  bool bVar1;
  ArgumentTuple *args_local;
  Action<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  internal::
  Apply<std::function<void(std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&)>const&,std::tuple<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>>
            (&this->fun_,args);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }